

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

size_t mbedtls_mpi_bitlen(mbedtls_mpi *X)

{
  size_t sVar1;
  size_t j;
  size_t i;
  mbedtls_mpi *X_local;
  
  if (X->n == 0) {
    X_local = (mbedtls_mpi *)0x0;
  }
  else {
    j = X->n;
    do {
      j = j - 1;
      if (j == 0) break;
    } while (X->p[j] == 0);
    sVar1 = mbedtls_clz(X->p[j]);
    X_local = (mbedtls_mpi *)(j * 0x40 + (0x40 - sVar1));
  }
  return (size_t)X_local;
}

Assistant:

size_t mbedtls_mpi_bitlen( const mbedtls_mpi *X )
{
    size_t i, j;

    if( X->n == 0 )
        return( 0 );

    for( i = X->n - 1; i > 0; i-- )
        if( X->p[i] != 0 )
            break;

    j = biL - mbedtls_clz( X->p[i] );

    return( ( i * biL ) + j );
}